

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O3

void kws_search_free(ps_search_t *search)

{
  int iVar1;
  undefined8 *ptr;
  long lVar2;
  glist_t g;
  char *pcVar3;
  double dVar4;
  
  iVar1 = *(int *)&search[2].type;
  lVar2 = ps_config_int(search->config,"frate");
  dVar4 = (double)iVar1 / (double)lVar2;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_search.c"
          ,0x1c8,"TOTAL kws %.2f CPU %.3f xRT\n",*(double *)&search[1].post,
          *(double *)&search[1].post / dVar4);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_search.c"
          ,0x1cb,"TOTAL kws %.2f wall %.3f xRT\n",*(double *)&search[1].start_wid,
          *(double *)&search[1].start_wid / dVar4);
  ps_search_base_free(search);
  hmm_context_free((hmm_context_t *)search[1].vt);
  kws_detections_reset((kws_detections_t *)search[1].name);
  ckd_free(search[1].name);
  ckd_free(search[1].d2p);
  pcVar3 = search[1].type;
  if (pcVar3 == (char *)0x0) {
    g = (glist_t)0x0;
  }
  else {
    do {
      ptr = *(undefined8 **)pcVar3;
      ckd_free((void *)ptr[2]);
      ckd_free((void *)*ptr);
      ckd_free(ptr);
      pcVar3 = *(char **)(pcVar3 + 8);
    } while (pcVar3 != (char *)0x0);
    g = (glist_t)search[1].type;
  }
  glist_free(g);
  ckd_free(search);
  return;
}

Assistant:

void
kws_search_free(ps_search_t * search)
{
    kws_search_t *kwss;
    double n_speech;
    gnode_t *gn;

    kwss = (kws_search_t *) search;

    n_speech = (double)kwss->n_tot_frame
        / ps_config_int(ps_search_config(kwss), "frate");

    E_INFO("TOTAL kws %.2f CPU %.3f xRT\n",
           kwss->perf.t_tot_cpu,
           kwss->perf.t_tot_cpu / n_speech);
    E_INFO("TOTAL kws %.2f wall %.3f xRT\n",
           kwss->perf.t_tot_elapsed,
           kwss->perf.t_tot_elapsed / n_speech);


    ps_search_base_free(search);
    hmm_context_free(kwss->hmmctx);
    kws_detections_reset(kwss->detections);
    ckd_free(kwss->detections);

    ckd_free(kwss->pl_hmms);
    for (gn = kwss->keyphrases; gn; gn = gnode_next(gn)) {
	kws_keyphrase_t *keyphrase = gnode_ptr(gn);
        ckd_free(keyphrase->hmms);
        ckd_free(keyphrase->word);
        ckd_free(keyphrase);
    }
    glist_free(kwss->keyphrases);
    ckd_free(kwss);
}